

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetMessageEntity(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  type_conflict4 tVar5;
  undefined8 *puVar6;
  self_type *psVar7;
  undefined1 **ppuVar8;
  iterator iVar9;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  path_type *data_00;
  dummy_u *pdVar11;
  Ptr PVar12;
  Ptr PVar13;
  undefined1 local_d8 [8];
  undefined1 auStack_d0 [16];
  undefined1 *local_c0 [3];
  element_type *local_a8;
  path_type local_a0;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  dummy_u local_50;
  
  *(undefined8 *)this = 0;
  puVar6 = (undefined8 *)operator_new(0x68);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_002aa100;
  puVar6[2] = 0;
  puVar6[3] = 0;
  puVar6[4] = 0;
  puVar6[5] = 0;
  puVar6[6] = 0;
  puVar6[7] = 0;
  puVar6[8] = 0;
  puVar6[9] = 0;
  puVar6[10] = 0;
  puVar6[0xb] = 0;
  puVar6[0xc] = 0;
  puVar6[2] = puVar6 + 4;
  puVar6[3] = 0;
  *(undefined1 *)(puVar6 + 4) = 0;
  puVar6[7] = puVar6 + 9;
  puVar6[8] = 0;
  *(undefined1 *)(puVar6 + 9) = 0;
  puVar6[0xb] = 0;
  puVar6[0xc] = 0;
  *(undefined8 **)(this + 8) = puVar6;
  *(string **)this = (string *)(puVar6 + 2);
  paVar1 = &local_a0.m_value.field_2;
  local_a8 = (element_type *)this;
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"type","");
  local_a0.m_separator = '.';
  local_a0.m_start._M_current = local_a0.m_value._M_dataplus._M_p;
  psVar7 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_a0);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_d8,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar7);
  std::__cxx11::string::operator=((string *)(puVar6 + 2),(string *)local_d8);
  if (local_d8 != (undefined1  [8])((long)auStack_d0 + 8U)) {
    operator_delete((void *)local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"offset","");
  local_a0.m_separator = '.';
  local_a0.m_start._M_current = local_a0.m_value._M_dataplus._M_p;
  psVar7 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_a0);
  std::locale::locale((locale *)local_70);
  std::locale::locale((locale *)local_d8,(locale *)local_70);
  tVar5 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar7,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     local_d8);
  std::locale::~locale((locale *)local_d8);
  std::locale::~locale((locale *)local_70);
  *(type_conflict4 *)(puVar6 + 6) = tVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"length","");
  local_a0.m_separator = '.';
  local_a0.m_start._M_current = local_a0.m_value._M_dataplus._M_p;
  psVar7 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_a0);
  std::locale::locale((locale *)local_70);
  std::locale::locale((locale *)local_d8,(locale *)local_70);
  tVar5 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar7,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     local_d8);
  std::locale::~locale((locale *)local_d8);
  std::locale::~locale((locale *)local_70);
  *(type_conflict4 *)((long)puVar6 + 0x34) = tVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"url","");
  local_a0.m_separator = '.';
  local_a0.m_start._M_current = local_a0.m_value._M_dataplus._M_p;
  local_50.aligner_ = (type)((long)local_50.data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_d8,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_a0);
  local_70[0] = local_60;
  pdVar11 = &local_50;
  if (local_d8[0] != (string)0x0) {
    pdVar11 = (dummy_u *)auStack_d0;
  }
  ppuVar8 = (undefined1 **)(local_50.data + 8);
  if (local_d8[0] != (string)0x0) {
    ppuVar8 = (undefined1 **)((long)auStack_d0 + 8);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pdVar11->aligner_,(long)*ppuVar8 + (long)pdVar11->aligner_);
  if (local_d8[0] == (string)0x1) {
    if ((undefined1 **)auStack_d0._0_8_ != local_c0) {
      operator_delete((void *)auStack_d0._0_8_);
    }
    local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffffffffff00);
  }
  pcVar2 = (local_a8->type)._M_dataplus._M_p;
  std::__cxx11::string::operator=((string *)(pcVar2 + 0x28),(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50.aligner_ != (type)((long)local_50.data + 0x10)) {
    operator_delete((void *)local_50.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"user","");
  data_00 = &local_a0;
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&data_00->m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_d8 = (undefined1  [8])0x0;
    auStack_d0._0_8_ = (type)0x0;
    _Var10._M_pi = extraout_RDX;
  }
  else {
    PVar12 = parseJsonAndGetUser((TgTypeParser *)local_d8,(ptree *)data_00);
    _Var10 = PVar12.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  uVar4 = auStack_d0._0_8_;
  auVar3 = local_d8;
  local_d8 = (undefined1  [8])0x0;
  auStack_d0._0_8_ = (type)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar2 + 0x50);
  *(undefined1 (*) [8])(pcVar2 + 0x48) = auVar3;
  *(undefined8 *)(pcVar2 + 0x50) = uVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var10._M_pi = extraout_RDX_00;
  }
  if ((type)auStack_d0._0_8_ != (type)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_d0._0_8_);
    _Var10._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
    _Var10._M_pi = extraout_RDX_02;
  }
  PVar13.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  PVar13.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
  return (Ptr)PVar13.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MessageEntity::Ptr TgTypeParser::parseJsonAndGetMessageEntity(const ptree& data) const{
    auto result(make_shared<MessageEntity>());
    result->type = data.get<string>("type");
    result->offset = data.get<int32_t>("offset");
    result->length = data.get<int32_t>("length");
    result->url = data.get<string>("url", "");
    result->user = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "user");
    return result;
}